

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optpfor.h
# Opt level: O1

uint32_t __thiscall
FastPForLib::OPTPFor<4U,_FastPForLib::Simple16<false>_>::findBestB
          (OPTPFor<4U,_FastPForLib::Simple16<false>_> *this,uint32_t *in,uint32_t len)

{
  uint32_t b;
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  uint32_t uVar11;
  long lVar12;
  long lVar13;
  uint32_t b_00;
  uint uVar14;
  uint *k;
  ushort uVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  int iVar22;
  undefined1 auVar23 [64];
  
  lVar12 = DAT_001c8348;
  b_00 = *(uint32_t *)(DAT_001c8348 + -4);
  uVar9 = tryB(this,b_00,in,len);
  lVar8 = NewPFor<4u,FastPForLib::Simple16<false>>::possLogs;
  iVar22 = 0;
  if (len != 0) {
    auVar17 = vpbroadcastq_avx512f();
    auVar23 = ZEXT1664((undefined1  [16])0x0);
    lVar13 = 0;
    auVar18 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar19 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar20 = vmovdqa64_avx512f(auVar23);
      auVar23 = vpbroadcastq_avx512f();
      auVar21 = vporq_avx512f(auVar23,auVar18);
      auVar23 = vporq_avx512f(auVar23,auVar19);
      uVar4 = vpcmpuq_avx512f(auVar23,auVar17,2);
      bVar5 = (byte)uVar4;
      uVar4 = vpcmpuq_avx512f(auVar21,auVar17,2);
      bVar6 = (byte)uVar4;
      uVar15 = CONCAT11(bVar6,bVar5);
      auVar23 = vmovdqu32_avx512f(*(undefined1 (*) [64])(in + lVar13));
      auVar21._4_4_ = (uint)((byte)(uVar15 >> 1) & 1) * auVar23._4_4_;
      auVar21._0_4_ = (uint)(bVar5 & 1) * auVar23._0_4_;
      auVar21._8_4_ = (uint)((byte)(uVar15 >> 2) & 1) * auVar23._8_4_;
      auVar21._12_4_ = (uint)((byte)(uVar15 >> 3) & 1) * auVar23._12_4_;
      auVar21._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * auVar23._16_4_;
      auVar21._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * auVar23._20_4_;
      auVar21._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * auVar23._24_4_;
      auVar21._28_4_ = (uint)((byte)(uVar15 >> 7) & 1) * auVar23._28_4_;
      auVar21._32_4_ = (uint)(bVar6 & 1) * auVar23._32_4_;
      auVar21._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar23._36_4_;
      auVar21._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar23._40_4_;
      auVar21._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar23._44_4_;
      auVar21._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar23._48_4_;
      auVar21._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar23._52_4_;
      auVar21._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar23._56_4_;
      auVar21._60_4_ = (uint)(bVar6 >> 7) * auVar23._60_4_;
      auVar23 = vpord_avx512f(auVar21,auVar20);
      lVar13 = lVar13 + 0x10;
    } while ((((ulong)len + 0x3fffffffffffffff & 0x3fffffffffffffff) + 0x10) -
             (ulong)((uint)((ulong)len + 0x3fffffffffffffff) & 0xf) != lVar13);
    auVar17 = vmovdqa32_avx512f(auVar23);
    auVar18._0_4_ = (uint)(bVar5 & 1) * auVar17._0_4_ | (uint)!(bool)(bVar5 & 1) * auVar20._0_4_;
    bVar1 = (bool)((byte)(uVar15 >> 1) & 1);
    auVar18._4_4_ = (uint)bVar1 * auVar17._4_4_ | (uint)!bVar1 * auVar20._4_4_;
    bVar1 = (bool)((byte)(uVar15 >> 2) & 1);
    auVar18._8_4_ = (uint)bVar1 * auVar17._8_4_ | (uint)!bVar1 * auVar20._8_4_;
    bVar1 = (bool)((byte)(uVar15 >> 3) & 1);
    auVar18._12_4_ = (uint)bVar1 * auVar17._12_4_ | (uint)!bVar1 * auVar20._12_4_;
    bVar1 = (bool)((byte)(uVar15 >> 4) & 1);
    auVar18._16_4_ = (uint)bVar1 * auVar17._16_4_ | (uint)!bVar1 * auVar20._16_4_;
    bVar1 = (bool)((byte)(uVar15 >> 5) & 1);
    auVar18._20_4_ = (uint)bVar1 * auVar17._20_4_ | (uint)!bVar1 * auVar20._20_4_;
    bVar1 = (bool)((byte)(uVar15 >> 6) & 1);
    auVar18._24_4_ = (uint)bVar1 * auVar17._24_4_ | (uint)!bVar1 * auVar20._24_4_;
    bVar1 = (bool)((byte)(uVar15 >> 7) & 1);
    auVar18._28_4_ = (uint)bVar1 * auVar17._28_4_ | (uint)!bVar1 * auVar20._28_4_;
    auVar18._32_4_ = (uint)(bVar6 & 1) * auVar17._32_4_ | (uint)!(bool)(bVar6 & 1) * auVar20._32_4_;
    bVar1 = (bool)(bVar6 >> 1 & 1);
    auVar18._36_4_ = (uint)bVar1 * auVar17._36_4_ | (uint)!bVar1 * auVar20._36_4_;
    bVar1 = (bool)(bVar6 >> 2 & 1);
    auVar18._40_4_ = (uint)bVar1 * auVar17._40_4_ | (uint)!bVar1 * auVar20._40_4_;
    bVar1 = (bool)(bVar6 >> 3 & 1);
    auVar18._44_4_ = (uint)bVar1 * auVar17._44_4_ | (uint)!bVar1 * auVar20._44_4_;
    bVar1 = (bool)(bVar6 >> 4 & 1);
    auVar18._48_4_ = (uint)bVar1 * auVar17._48_4_ | (uint)!bVar1 * auVar20._48_4_;
    bVar1 = (bool)(bVar6 >> 5 & 1);
    auVar18._52_4_ = (uint)bVar1 * auVar17._52_4_ | (uint)!bVar1 * auVar20._52_4_;
    bVar1 = (bool)(bVar6 >> 6 & 1);
    auVar18._56_4_ = (uint)bVar1 * auVar17._56_4_ | (uint)!bVar1 * auVar20._56_4_;
    auVar18._60_4_ =
         (uint)(bVar6 >> 7) * auVar17._60_4_ | (uint)!(bool)(bVar6 >> 7) * auVar20._60_4_;
    auVar16 = vextracti64x4_avx512f(auVar18,1);
    auVar17 = vpord_avx512f(auVar18,ZEXT3264(auVar16));
    auVar2 = vpor_avx(auVar17._0_16_,auVar17._16_16_);
    auVar3 = vpshufd_avx(auVar2,0xee);
    auVar2 = vpor_avx(auVar2,auVar3);
    auVar3 = vpshufd_avx(auVar2,0x55);
    auVar2 = vpor_avx(auVar2,auVar3);
    iVar22 = auVar2._0_4_;
  }
  uVar14 = 0;
  do {
    uVar10 = uVar14;
    if (iVar22 == 0) break;
    uVar14 = uVar10 + 1;
  } while (*(int *)(NewPFor<4u,FastPForLib::Simple16<false>>::possLogs + (ulong)uVar10 * 4) + 0x1cU
           < 0x20U - LZCOUNT(iVar22));
  lVar12 = lVar12 - NewPFor<4u,FastPForLib::Simple16<false>>::possLogs;
  uVar14 = uVar10 + 1;
  while (uVar7 = uVar14, (ulong)uVar10 < (lVar12 >> 2) - 1U) {
    b = *(uint32_t *)(lVar8 + (ulong)uVar10 * 4);
    uVar11 = tryB(this,b,in,len);
    uVar14 = uVar9;
    if (uVar11 < uVar9) {
      uVar14 = uVar11;
    }
    if (uVar11 <= uVar9) {
      b_00 = b;
    }
    uVar9 = uVar14;
    uVar14 = uVar7 + 1;
    uVar10 = uVar7;
  }
  return b_00;
}

Assistant:

__attribute__((pure)) uint32_t
OPTPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::findBestB(
    const uint32_t *in, uint32_t len) {
  uint32_t b =
      NewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::possLogs.back();
  assert(b == 32);
  uint32_t bsize = tryB(b, in, len);
  const uint32_t mb = maxbits(in, in + len);
  uint32_t i = 0;
  while (mb >
         28 + NewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::possLogs[i])
    ++i; // some schemes such as Simple16 don't code numbers greater than 28

  for (;
       i <
       NewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::possLogs.size() - 1;
       i++) {
    const uint32_t csize =
        tryB(NewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::possLogs[i],
             in, len);

    if (csize <= bsize) {
      b = NewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::possLogs[i];
      bsize = csize;
    }
  }
  return b;
}